

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionCall1(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  SmallArray<ArgumentData,_1U> arguments;
  
  arguments.allocator = ctx->allocator;
  arguments.data = arguments.little;
  arguments.little[0].source = arg0->source;
  arguments.little[0].type = arg0->type;
  arguments.count = 1;
  arguments.max = 1;
  arguments.little[0].isExplicit = false;
  arguments.little[0].name = (SynIdentifier *)0x0;
  arguments.little[0].valueFunction = (FunctionData *)0x0;
  arguments_00._8_8_ = 1;
  arguments_00.data = arguments.data;
  arguments.little[0].value = arg0;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup);
  SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall1(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 1> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}